

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O2

void ppu_tick(nes_system *system)

{
  uint16_t *puVar1;
  uint8_t *puVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  uint8_t uVar7;
  byte bVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  _func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *p_Var14;
  nes_cartridge *pnVar15;
  _func_void_nes_video_output_ptr_void_ptr *p_Var16;
  short sVar17;
  uint8_t uVar18;
  byte bVar19;
  byte bVar20;
  uint16_t uVar21;
  bool bVar22;
  byte bVar23;
  uint32_t i;
  uint uVar24;
  nes_system_state *state;
  uint uVar25;
  nes_ppu_render_mask nVar26;
  ushort uVar27;
  uint32_t i_1;
  nes_ppu_render_mask nVar28;
  int iVar29;
  byte bVar30;
  byte bVar31;
  anon_union_2_2_2ecd3576_for_nes_ppu_12 aVar32;
  ushort uVar33;
  ushort uVar34;
  nes_ppu_render_mask nVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  bool bVar39;
  ulong uVar40;
  long lStack_60;
  byte local_49;
  nes_video_output local_40;
  
  uVar7 = (system->state).ppu.reg_rw_mode;
  bVar20 = (system->state).ppu.field_0xa;
  if ((bVar20 & 0x18) != 0) {
    uVar27 = (system->state).ppu.vram_address;
    uVar37 = uVar27 & 0x3fff;
    uVar40 = (ulong)uVar37;
    uVar33 = (ushort)uVar37;
    if ((bVar20 & 8) == 0) {
      p_Var14 = (system->config).memory_callback;
      if (p_Var14 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
      {
        (*p_Var14)(NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_WRITE,uVar27,&(system->state).ppu.vram_data,
                   (system->config).client_data);
      }
      if (uVar33 < 0x2000) {
        if (system->cartridge->chr_rom_size <= uVar40) {
          (system->state).chr_ram[uVar40] = (system->state).ppu.vram_data;
        }
      }
      else {
        uVar21 = get_ppu_nametable_address(system,uVar33);
        (system->state).vram[uVar21] = (system->state).ppu.vram_data;
      }
    }
    else {
      if (uVar33 < 0x2000) {
        pnVar15 = system->cartridge;
        if (uVar40 < pnVar15->chr_rom_size) {
          uVar18 = (*pnVar15->mapper->read_chr)(pnVar15,uVar33);
        }
        else {
          uVar18 = (system->state).chr_ram[uVar40];
        }
      }
      else {
        uVar21 = get_ppu_nametable_address(system,uVar33);
        uVar18 = (system->state).vram[uVar21];
      }
      (system->state).ppu.vram_data = uVar18;
      p_Var14 = (system->config).memory_callback;
      if (p_Var14 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
      {
        (*p_Var14)(NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_READ,(system->state).ppu.vram_address,
                   &(system->state).ppu.vram_data,(system->config).client_data);
      }
    }
  }
  nVar26 = (system->state).ppu.next_render_mask;
  uVar37 = (system->state).ppu.dot + 1;
  (system->state).ppu.dot = uVar37;
  if (0x154 < uVar37) {
    uVar37 = 0;
    (system->state).ppu.scanline = ((system->state).ppu.scanline + 1) % 0x106;
    (system->state).ppu.dot = 0;
  }
  local_49 = (system->state).ppu.status.b;
  if ((char)local_49 < '\0') {
    bVar20 = (system->state).ppu.ctrl.b >> 2 & 0x20;
  }
  else {
    bVar20 = 0;
  }
  bVar23 = (system->state).ppu.field_0xa;
  bVar19 = bVar23 & 0xdf | bVar20;
  (system->state).ppu.field_0xa = bVar19;
  uVar11 = (system->state).ppu.scanline;
  if (uVar11 == 0x105) {
    if (uVar37 == 1) {
      local_49 = local_49 & 0x1f;
      (system->state).ppu.status.b = local_49;
      (system->state).ppu.is_even_frame = (uint)((system->state).ppu.is_even_frame == 0);
      bVar30 = 0;
      for (lVar38 = 0; lVar38 != 8; lVar38 = lVar38 + 1) {
        bVar31 = (system->state).ppu.open_bus_decay_timer[lVar38];
        (system->state).ppu.open_bus_decay_timer[lVar38] = bVar31 + 1;
        bVar30 = bVar30 | (bVar31 < 0x24) << ((byte)lVar38 & 0x1f);
      }
      puVar2 = &(system->state).ppu.open_bus;
      *puVar2 = *puVar2 & bVar30;
    }
  }
  else if (uVar11 == 0xf1) {
    if (uVar37 == 1) {
      local_49 = local_49 & 0x7f | (system->state).ppu.pre_vblank << 7;
      (system->state).ppu.status.b = local_49;
    }
    else if (uVar37 == 0) {
      (system->state).ppu.pre_vblank = '\x01';
    }
  }
  if ((bVar23 & 0x18) != 0) {
    if ((0xef < uVar11 && uVar11 != 0x105) ||
       (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
      sVar17 = 0x20;
      if (((system->state).ppu.ctrl.b & 4) == 0) {
        sVar17 = 1;
      }
      puVar1 = &(system->state).ppu.vram_address;
      *puVar1 = *puVar1 + sVar17;
    }
    if ((system->state).ppu.update_cpu_read_buffer != 0) {
      (system->state).ppu.cpu_read_buffer = (system->state).ppu.vram_data;
      (system->state).ppu.update_cpu_read_buffer = 0;
    }
    bVar19 = bVar23 & 199 | bVar20;
    (system->state).ppu.field_0xa = bVar19;
  }
  uVar18 = (system->state).ppu.reg_rw_mode;
  if (uVar18 != '\0') {
    bVar20 = 0xff;
    if (uVar18 == '\x01') {
      (system->state).ppu.reg_data = (system->state).ppu.open_bus;
      bVar20 = 0;
    }
    switch(bVar19 & 7) {
    case 0:
      if (uVar18 == '\x02') {
        bVar23 = (system->state).ppu.reg_data;
        (system->state).ppu.ctrl.b = bVar23;
        (system->state).ppu.field_11.t_addr_reg =
             (system->state).ppu.field_11.t_addr_reg & 0xf3ff | (bVar23 & 3) << 10;
      }
      break;
    case 1:
      if (uVar18 == '\x02') {
        nVar26 = (nes_ppu_render_mask)(system->state).ppu.reg_data;
      }
      break;
    case 2:
      if (uVar18 != '\x01') break;
      bVar23 = (system->state).ppu.open_bus & 0x1f | local_49 & 0xe0;
      (system->state).ppu.reg_data = bVar23;
      local_49 = local_49 & 0x7f;
      (system->state).ppu.status.b = local_49;
      (system->state).ppu.write_toggle = 0;
      (system->state).ppu.pre_vblank = '\0';
      uVar25 = 0xe0;
      goto LAB_00104fcb;
    case 3:
      if (uVar18 == '\x02') {
        (system->state).ppu.oam_address = (system->state).ppu.reg_data;
      }
      break;
    case 4:
      if (uVar18 != '\x02') {
        bVar23 = (system->state).ppu.sprite_shift_high
                 [(ulong)(system->state).ppu.oam_address + 0x25];
        (system->state).ppu.reg_data = bVar23;
        uVar25 = 0xff;
        goto LAB_00104fcb;
      }
      bVar23 = (system->state).ppu.oam_address;
      bVar30 = (system->state).ppu.reg_data;
      bVar31 = bVar30 & 0xe3;
      if ((bVar23 & 3) != 2) {
        bVar31 = bVar30;
      }
      (system->state).ppu.sprite_shift_high[(ulong)bVar23 + 0x25] = bVar31;
      (system->state).ppu.oam_address = bVar23 + 1;
      break;
    case 5:
      if (uVar18 == '\x02') {
        iVar29 = (system->state).ppu.write_toggle;
        bVar23 = (system->state).ppu.reg_data;
        uVar33 = (ushort)(bVar23 >> 3);
        uVar34 = bVar23 & 7;
        uVar27 = (system->state).ppu.field_11.t_addr_reg;
        if (iVar29 == 0) {
          uVar21 = uVar27 & 0xffe0 | uVar33;
          (system->state).ppu.fine_x = (uint8_t)uVar34;
        }
        else {
          uVar21 = uVar34 << 0xc | uVar27 & 0x8c1f | uVar33 << 5;
        }
        (system->state).ppu.field_11.t_addr_reg = uVar21;
        (system->state).ppu.write_toggle = (uint)(iVar29 == 0);
      }
      break;
    case 6:
      if (uVar18 == '\x02') {
        iVar29 = (system->state).ppu.write_toggle;
        if (iVar29 == 0) {
          aVar32.t_addr_reg =
               (ushort)(byte)(system->state).ppu.vram_address |
               ((system->state).ppu.reg_data & 0x7f) << 8;
          lStack_60 = 0x12;
        }
        else {
          aVar32.t_addr_reg._1_1_ = *(undefined1 *)((long)&(system->state).ppu.field_11 + 1);
          aVar32.t_addr_reg._0_1_ = (system->state).ppu.reg_data;
          (system->state).ppu.field_11 = aVar32;
          (system->state).ppu.field_10 = (anon_union_2_2_812c8e36_for_nes_ppu_10)aVar32;
          lStack_60 = 0x5e;
        }
        *(anon_union_2_2_2ecd3576_for_nes_ppu_12 *)
         ((system->state).ppu.sprite_attributes + lStack_60 + -0x24) = aVar32;
        (system->state).ppu.write_toggle = (uint)(iVar29 == 0);
      }
      break;
    case 7:
      uVar27 = (system->state).ppu.vram_address;
      if ((uVar27 & 0xff00) == 0x3f00) {
        uVar25 = 0x1f;
        if ((uVar27 & 0x13) == 0x10) {
          uVar25 = 0xc;
        }
        if (uVar18 == '\x02') {
          (system->state).ppu.palettes[uVar25 & uVar27] = (system->state).ppu.reg_data;
          if ((0xef < uVar11 && uVar11 != 0x105) ||
             (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
            uVar21 = uVar27 + 1;
            if (((system->state).ppu.ctrl.b & 4) != 0) {
              uVar21 = uVar27 + 0x20;
            }
            (system->state).ppu.vram_address = uVar21;
          }
        }
        else {
          bVar19 = bVar19 | 8;
          (system->state).ppu.field_0xa = bVar19;
          (system->state).ppu.reg_data =
               (system->state).ppu.open_bus & 0xc0 |
               (system->state).ppu.palettes[uVar25 & uVar27] & 0x3f;
          (system->state).ppu.update_cpu_read_buffer = 1;
          bVar20 = 0x3f;
        }
      }
      else if (uVar18 == '\x02') {
        bVar19 = bVar19 | 0x10;
        (system->state).ppu.field_0xa = bVar19;
        (system->state).ppu.vram_data = (system->state).ppu.reg_data;
      }
      else {
        bVar19 = bVar19 | 8;
        (system->state).ppu.field_0xa = bVar19;
        (system->state).ppu.reg_data = (system->state).ppu.cpu_read_buffer;
        (system->state).ppu.update_cpu_read_buffer = 1;
        bVar20 = 0xff;
      }
      if ((uVar11 < 0xf0 || uVar11 == 0x105) &&
         (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) != 0)) {
        uVar25 = *(uint *)&(system->state).ppu.field_10;
        if ((~uVar25 & 0x1f) == 0) {
          uVar25 = uVar25 & 0xffffffe0 ^ 0x400;
        }
        else {
          uVar25 = uVar25 & 0xffffffe0 | uVar25 + 1 & 0x1f;
        }
        uVar27 = (ushort)uVar25;
        (system->state).ppu.field_10.v_addr_reg = uVar27;
        if ((~uVar25 & 0x7000) == 0) {
          (system->state).ppu.field_10.v_addr_reg = uVar27 & 0x8fff;
          uVar25 = uVar25 >> 5 & 0x1f;
          if ((short)uVar25 == 0x1f) {
            uVar21 = uVar27 & 0x8c1f;
          }
          else {
            if (uVar25 != 0x1d) {
              uVar33 = uVar27 + 0x20 & 0x3e0;
              uVar27 = uVar27 & 0x8c1f;
              goto LAB_00104fb8;
            }
            uVar21 = uVar27 & 0x8c1f ^ 0x800;
          }
        }
        else {
          uVar33 = uVar27 + 0x1000 & 0x7000;
          uVar27 = uVar27 & 0x8fff;
LAB_00104fb8:
          uVar21 = uVar27 | uVar33;
        }
        (system->state).ppu.field_10.v_addr_reg = uVar21;
      }
    }
    if (bVar20 != 0) {
      bVar23 = (system->state).ppu.reg_data;
      uVar25 = (uint)bVar20;
LAB_00104fcb:
      (system->state).ppu.open_bus = bVar23;
      for (lVar38 = 0; lVar38 != 8; lVar38 = lVar38 + 1) {
        if ((uVar25 >> ((uint)lVar38 & 0x1f) & 1) != 0) {
          (system->state).ppu.open_bus_decay_timer[lVar38] = '\0';
        }
      }
    }
    (system->state).ppu.reg_rw_mode = '\0';
  }
  nVar28 = (system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER;
  if (((nVar26 & NES_PPU_RENDER_MASK_RENDER) == 0) == (nVar28 != 0)) {
    nVar35 = nVar26 & ~NES_PPU_RENDER_MASK_RENDER | nVar28;
  }
  else {
    (system->state).ppu.next_render_mask = nVar26;
    nVar28 = nVar26 & NES_PPU_RENDER_MASK_RENDER;
    nVar35 = nVar26;
  }
  (system->state).ppu.render_mask = nVar35;
  if ((0xef < uVar11 && uVar11 != 0x105) || (nVar28 == 0)) goto LAB_00105741;
  bVar20 = (system->state).ppu.ctrl.b;
  iVar29 = 8 << (bVar20 >> 5 & 1);
  if (uVar37 < 0x102) {
    if (((nVar35 & NES_PPU_RENDER_MASK_BACKGROUND) == 0) ||
       ((uVar37 < 10 && ((nVar35 & NES_PPU_RENDER_MASK_LEFTMOST_BACKGROUND) == 0)))) {
      uVar25 = 0;
      bVar39 = true;
      bVar22 = false;
    }
    else {
      uVar18 = (system->state).ppu.fine_x;
      uVar25 = (system->state).ppu.bg_shift_high >> (0xe - uVar18 & 0x1f) & 2 |
               (uint)(((system->state).ppu.bg_shift_low >> ((byte)(0xf - uVar18) & 0x1f) & 1) != 0);
      bVar39 = uVar25 == 0;
      if (bVar39) {
        uVar25 = 0;
      }
      else {
        uVar25 = (system->state).ppu.attr_shift_high >> (0xc - uVar18 & 0x1f) & 8 |
                 (system->state).ppu.attr_shift_low >> (0xd - uVar18 & 0x1f) & 4 | uVar25;
      }
      bVar22 = !bVar39;
    }
    uVar36 = uVar37 - 2;
    if (((nVar35 & NES_PPU_RENDER_MASK_SPRITES) != 0) &&
       ((9 < uVar37 || ((nVar35 & NES_PPU_RENDER_MASK_LEFTMOST_SPRITES) != 0)))) {
      for (lVar38 = 0; lVar38 != 8; lVar38 = lVar38 + 1) {
        bVar23 = (system->state).ppu.sprite_x_positions[lVar38];
        if ((((int)(uint)bVar23 <= (int)uVar36) && ((int)uVar36 < (int)(bVar23 + 8))) &&
           (bVar23 = (bVar23 - (char)uVar37) + 1,
           uVar24 = (uint)(((system->state).ppu.sprite_shift_low[lVar38] >> (bVar23 & 7) & 1) != 0)
                    | (uint)((system->state).ppu.sprite_shift_high[lVar38] >> (bVar23 & 7)) * 2 & 2,
           uVar24 != 0)) {
          if (((lVar38 == 0) && ((system->state).ppu.sprite_0_test != '\0')) &&
             ((local_49 & 0x40) == 0)) {
            local_49 = (bVar22 & uVar36 != 0xff) << 6 | local_49;
            (system->state).ppu.status.b = local_49;
          }
          bVar23 = (system->state).ppu.sprite_attributes[lVar38].b;
          if ((bool)(bVar39 | (bVar23 & 0x20) == 0)) {
            uVar25 = uVar24 + (bVar23 & 3) * 4 + 0x10;
          }
          break;
        }
      }
    }
    bVar23 = (system->state).ppu.palettes[uVar25];
    bVar30 = bVar23 & 0x30;
    if ((nVar35 & NES_PPU_RENDER_MASK_GRAYSCALE) == 0) {
      bVar30 = bVar23;
    }
    (system->state).ppu.color_out = bVar30;
    if (uVar37 - 0x142 < 0x10 || uVar36 < 0x100) goto LAB_00105244;
    if (uVar37 != 0) goto LAB_00105258;
LAB_001052d0:
    if ((uVar37 - 1 < 0x140) && ((nVar35 & NES_PPU_RENDER_MASK_SPRITES) != 0)) {
      uVar25 = uVar37 - 0x101 >> 3;
      uVar40 = (ulong)uVar25;
      bVar23 = (system->state).ppu.eval_oam_byte_count;
      bVar30 = (system->state).ppu.palettes[uVar40 * 4 + -0x20];
      bVar31 = (system->state).ppu.palettes[uVar40 * 4 + -0x1f];
      bVar8 = (system->state).ppu.palettes[uVar40 * 4 + -0x1e];
      uVar18 = (system->state).ppu.palettes[uVar40 * 4 + -0x1d];
      (system->state).ppu.oam_address = '\0';
      (system->state).ppu.sprite_0_test = (system->state).ppu.eval_oam_has_sprite_zero;
      sVar17 = (short)iVar29;
      switch(uVar37 & 7) {
      case 0:
        bVar20 = (system->state).ppu.vram_data;
        if ((bVar8 & 0x40) != 0) {
          bVar20 = (byte)(((ulong)bVar20 * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20);
        }
        (system->state).ppu.sprite_shift_high[uVar40] = bVar20;
        if (bVar23 >> 2 <= uVar25) {
          (system->state).ppu.sprite_shift_high[uVar40] = '\0';
          (system->state).ppu.sprite_shift_low[uVar40] = '\0';
        }
        break;
      case 1:
        (system->state).ppu.sprite_attributes[uVar40].b = bVar8;
        break;
      case 2:
        (system->state).ppu.sprite_x_positions[uVar40] = uVar18;
        break;
      case 5:
        uVar27 = (ushort)bVar31 << 4 & 0xffe0;
        if ((bVar20 & 0x20) == 0) {
          uVar27 = (ushort)bVar31 << 4;
          bVar31 = bVar20 >> 3;
        }
        uVar34 = (short)uVar11 - (ushort)bVar30;
        uVar33 = sVar17 + ~uVar34;
        if (-1 < (char)bVar8) {
          uVar33 = uVar34;
        }
        (system->state).ppu.field_0xa = bVar19 | 8;
        (system->state).ppu.vram_address =
             (ushort)(bVar31 & 1) << 0xc | uVar27 | (uVar33 & 8) + uVar33;
        break;
      case 6:
        bVar20 = (system->state).ppu.vram_data;
        if ((bVar8 & 0x40) == 0) {
          (system->state).ppu.sprite_shift_low[uVar40] = bVar20;
        }
        else {
          (system->state).ppu.sprite_shift_low[uVar40] =
               (uint8_t)(((ulong)bVar20 * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20);
        }
        break;
      case 7:
        uVar27 = (ushort)bVar31 << 4 & 0xffe0;
        if ((bVar20 & 0x20) == 0) {
          uVar27 = (ushort)bVar31 << 4;
          bVar31 = bVar20 >> 3;
        }
        uVar34 = (short)uVar11 - (ushort)bVar30;
        uVar33 = sVar17 + ~uVar34;
        if (-1 < (char)bVar8) {
          uVar33 = uVar34;
        }
        (system->state).ppu.field_0xa = bVar19 | 8;
        (system->state).ppu.vram_address =
             (uVar33 & 8) + uVar33 + 8 | (ushort)(bVar31 & 1) << 0xc | uVar27;
      }
    }
    if (uVar11 == 0x105) {
      if (uVar37 - 0x118 < 0x19) {
        uVar10 = (system->state).ppu.field_10;
        (system->state).ppu.field_10.v_addr_reg =
             (system->state).ppu.field_11.t_addr_reg & 0x7be0 | uVar10 & 0x841f;
      }
      else if ((uVar37 == 0x153) && ((system->state).ppu.is_even_frame == 0)) {
        (system->state).ppu.dot = 0x154;
      }
    }
    goto LAB_00105741;
  }
  (system->state).ppu.color_out = '\x0f';
  if (uVar37 - 0x142 < 0x10) {
LAB_00105244:
    uVar3 = (system->state).ppu.bg_shift_low;
    uVar4 = (system->state).ppu.bg_shift_high;
    uVar5 = (system->state).ppu.attr_shift_low;
    uVar6 = (system->state).ppu.attr_shift_high;
    (system->state).ppu.bg_shift_low = uVar3 * 2;
    (system->state).ppu.bg_shift_high = uVar4 * 2;
    (system->state).ppu.attr_shift_low = uVar5 * 2;
    (system->state).ppu.attr_shift_high = uVar6 * 2;
  }
LAB_00105258:
  if (0x100 < uVar37 && 0xf < uVar37 - 0x141) {
    if (uVar37 == 0x101) {
      uVar9 = (system->state).ppu.field_10;
      (system->state).ppu.field_10.v_addr_reg =
           (system->state).ppu.field_11.t_addr_reg & 0x41f | uVar9 & 0xfbe0;
    }
    goto LAB_001052d0;
  }
  switch(uVar37 & 7) {
  case 0:
    uVar25 = *(uint *)&(system->state).ppu.field_10;
    if ((~uVar25 & 0x1f) == 0) {
      uVar25 = uVar25 & 0xffffffe0 ^ 0x400;
    }
    else {
      uVar25 = uVar25 & 0xffffffe0 | uVar25 + 1 & 0x1f;
    }
    uVar27 = (ushort)uVar25;
    (system->state).ppu.field_10.v_addr_reg = uVar27;
    if (uVar37 == 1) goto LAB_001054cd;
    if (uVar37 != 0x100) goto LAB_00105633;
    if ((~uVar25 & 0x7000) == 0) {
      uVar25 = uVar25 >> 5 & 0x1f;
      if ((short)uVar25 == 0x1f) {
        uVar27 = uVar27 & 0x8c1f;
      }
      else {
        if (uVar25 != 0x1d) {
          uVar33 = uVar27 + 0x20 & 0x3e0;
          uVar27 = uVar27 & 0x8c1f;
          goto LAB_00105708;
        }
        uVar27 = uVar27 & 0x8c1f ^ 0x800;
      }
    }
    else {
      uVar33 = uVar27 + 0x1000 & 0x7000;
      uVar27 = uVar27 & 0x8fff;
LAB_00105708:
      uVar27 = uVar27 | uVar33;
    }
    (system->state).ppu.field_10.v_addr_reg = uVar27;
    goto LAB_0010570e;
  case 1:
    bVar20 = (system->state).ppu.palette_attribute;
    uVar40._0_2_ = (system->state).ppu.bg_shift_low;
    uVar40._2_2_ = (system->state).ppu.bg_shift_high;
    uVar40._4_2_ = (system->state).ppu.attr_shift_low;
    uVar40._6_2_ = (system->state).ppu.attr_shift_high;
    uVar40 = (ulong)CONCAT14(-(bVar20 & 1),
                             (uint)(system->state).ppu.vram_data << 0x10 |
                             (uint)(system->state).ppu.bitplane_slice_low) |
             (ulong)(byte)((char)(bVar20 << 6) >> 7) << 0x30 | uVar40;
    (system->state).ppu.bg_shift_low = (short)uVar40;
    (system->state).ppu.bg_shift_high = (short)(uVar40 >> 0x10);
    (system->state).ppu.attr_shift_low = (short)(uVar40 >> 0x20);
    (system->state).ppu.attr_shift_high = (short)(uVar40 >> 0x30);
    (system->state).ppu.field_0xa = bVar19 | 8;
    uVar27 = (system->state).ppu.field_10.v_addr_reg & 0xfff | 0x2000;
    break;
  case 2:
    (system->state).ppu.tile_value = (system->state).ppu.vram_data;
    goto LAB_001054c4;
  case 3:
    (system->state).ppu.field_0xa = bVar19 | 8;
    uVar27 = (system->state).ppu.field_10.v_addr_reg;
    uVar27 = (uVar27 >> 2 & 7) + (uVar27 >> 4 & 0x38 | uVar27 & 0xc00) + 0x23c0;
    break;
  case 4:
    bVar20 = (system->state).ppu.vram_data;
    (system->state).ppu.palette_attribute = bVar20;
    uVar27 = (system->state).ppu.field_10.v_addr_reg;
    bVar23 = (byte)uVar27;
    if ((uVar27 & 0x42) != 0) {
      (system->state).ppu.palette_attribute = (bVar20 >> (bVar23 >> 4 & 4)) >> (bVar23 & 2);
    }
    goto LAB_001054c4;
  case 5:
    (system->state).ppu.field_0xa = bVar19 | 8;
    uVar27 = (system->state).ppu.field_10.v_addr_reg >> 0xc & 7 |
             (ushort)(system->state).ppu.tile_value << 4 | (bVar20 & 0x10) << 8;
    break;
  case 6:
    (system->state).ppu.bitplane_slice_low = (system->state).ppu.vram_data;
    goto LAB_001054c4;
  case 7:
    (system->state).ppu.field_0xa = bVar19 | 8;
    uVar27 = (system->state).ppu.field_10.v_addr_reg >> 0xc |
             (ushort)(system->state).ppu.tile_value << 4 | (ushort)(bVar20 >> 4 & 1) << 0xc | 8;
  }
  (system->state).ppu.vram_address = uVar27;
LAB_001054c4:
  if (uVar37 == 1) {
LAB_001054cd:
    (system->state).ppu.eval_oam_has_sprite_zero = '\0';
    (system->state).ppu.eval_oam_byte_count = '\0';
    (system->state).ppu.eval_oam_src_addr = '\0';
LAB_001054d6:
    (system->state).ppu.palettes[(ulong)(uVar37 - 1 >> 1) - 0x20] = 0xff;
    goto LAB_00105741;
  }
LAB_00105633:
  if (0x100 < uVar37) goto LAB_00105741;
  if (uVar37 < 0x41) goto LAB_001054d6;
  if ((uVar37 & 1) != 0) {
    (system->state).ppu.eval_oam_entry_data =
         (system->state).ppu.sprite_shift_high[(ulong)(system->state).ppu.oam_address + 0x25];
    goto LAB_00105741;
  }
LAB_0010570e:
  bVar20 = (system->state).ppu.oam_address;
  if (bVar20 < (system->state).ppu.eval_oam_src_addr) goto LAB_00105741;
  (system->state).ppu.eval_oam_src_addr = bVar20;
  bVar23 = (system->state).ppu.eval_oam_byte_count;
  if ((bVar23 & 3) == 0) {
    bVar19 = (system->state).ppu.eval_oam_entry_data;
    if (((bVar19 < 0xf0) && (bVar19 <= uVar11)) && (uVar11 < iVar29 + (uint)bVar19)) {
      if (uVar37 == 0x42) {
        (system->state).ppu.eval_oam_has_sprite_zero = '\x01';
      }
      if (bVar23 != 0x20) goto LAB_00105726;
      (system->state).ppu.status.b = local_49 | 0x20;
      goto LAB_0010573c;
    }
    (system->state).ppu.oam_address = bVar20 + 4;
    if (bVar23 != 0x20) goto LAB_00105741;
    bVar20 = bVar20 + 1 & 3 | bVar20 + 4 & 0xfc;
  }
  else {
LAB_00105726:
    if (bVar23 < 0x20) {
      uVar18 = (system->state).ppu.eval_oam_entry_data;
      (system->state).ppu.eval_oam_byte_count = bVar23 + 1;
      (system->state).ppu.palettes[(ulong)bVar23 - 0x20] = uVar18;
    }
LAB_0010573c:
    bVar20 = bVar20 + 1;
  }
  (system->state).ppu.oam_address = bVar20;
LAB_00105741:
  (system->state).ppu.render_mask = (system->state).ppu.next_render_mask;
  (system->state).ppu.next_render_mask = nVar26;
  if (((uVar7 == '\x01') && ((system->state).cpu.rw_mode == '\x01')) &&
     (uVar27 = (system->state).cpu.address, (uVar27 & 0xe000) == 0x2000)) {
    uVar7 = (system->state).ppu.reg_data;
    (system->state).cpu.data = uVar7;
    (system->state).cached_ppu_reg[uVar27 & 7] = uVar7;
    p_Var14 = (system->config).memory_callback;
    if ((p_Var14 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
       && ((*p_Var14)(NES_MEMORY_TYPE_CPU,NES_MEMORY_OP_READ,uVar27,&(system->state).cpu.data,
                      (system->config).client_data), (char)(uVar27 & 7) == '\x04')) {
      (*(system->config).memory_callback)
                (NES_MEMORY_TYPE_OAM,NES_MEMORY_OP_READ,(uint16_t)(system->state).ppu.oam_address,
                 &(system->state).ppu.reg_data,(system->config).client_data);
    }
  }
  uVar12 = (system->state).ppu.dot;
  uVar13 = (system->state).ppu.scanline;
  system->framebuffer[uVar13 * 0x155 + uVar12] = (system->state).ppu.color_out;
  if (((uVar12 == 0) && (uVar13 == 0xf1)) &&
     (p_Var16 = (system->config).video_callback,
     p_Var16 != (_func_void_nes_video_output_ptr_void_ptr *)0x0)) {
    local_40.framebuffer = (nes_pixel *)(system->framebuffer + 0xaaa);
    local_40.width = 0x100;
    local_40.height = 0xe0;
    local_40._12_1_ = (system->state).ppu.is_even_frame == 0;
    (*p_Var16)(&local_40,(system->config).client_data);
  }
  return;
}

Assistant:

static void ppu_tick(nes_system* system)
{
    nes_system_state* state = &system->state;

    int is_reg_read = (state->ppu.reg_rw_mode == NES_PPU_REG_RW_MODE_READ);

    if (state->ppu.r | state->ppu.w)
        ppu_mem_rw(system);

    nes_ppu_execute(&state->ppu);

    if (is_reg_read)
        ppu_cpu_bus(system);
    
    system->framebuffer[state->ppu.scanline * SCANLINE_WIDTH + state->ppu.dot] = state->ppu.color_out;
   
    if (system->config.video_callback && state->ppu.scanline == (RENDER_END_SCANLINE + 1) && state->ppu.dot == 0)
    {
        nes_video_output video_output;
        video_output.framebuffer = (nes_pixel*)(system->framebuffer + 2 + (NES_FRAMEBUFFER_ROW_STRIDE * 8));
        video_output.width  = 256;
        video_output.height = 224;
        video_output.odd_frame = !state->ppu.is_even_frame;
        video_output.emphasize_red      = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_RED;
        video_output.emphasize_green    = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_GREEN;
        video_output.emphasize_blue     = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_BLUE;

        system->config.video_callback(&video_output, system->config.client_data);
    }
}